

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecHsh.h
# Opt level: O1

int * Hsh_IntManLookup(Hsh_IntMan_t *p,uint *pData)

{
  byte *pbVar1;
  int iVar2;
  uint *puVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  uint *puVar8;
  word *pwVar9;
  
  iVar2 = p->nSize;
  uVar4 = p->vTable->nSize;
  if (iVar2 * 4 == 0) {
    uVar7 = 0;
  }
  else {
    uVar6 = 0;
    uVar7 = 0;
    do {
      pbVar1 = (byte *)((long)pData + uVar6);
      uVar6 = uVar6 + 1;
      uVar7 = (*pbVar1 + uVar7) * 0x401;
      uVar7 = uVar7 >> 6 ^ uVar7;
    } while ((uint)(iVar2 * 4) != uVar6);
    uVar7 = uVar7 * 9;
  }
  uVar6 = (ulong)((uVar7 >> 0xb ^ uVar7) * 0x8001) % (ulong)uVar4;
  iVar5 = (int)uVar6;
  if ((-1 < iVar5) && (iVar5 < (int)uVar4)) {
    puVar3 = (uint *)(p->vTable->pArray + uVar6);
    while( true ) {
      puVar8 = puVar3;
      uVar4 = *puVar8;
      if ((ulong)uVar4 == 0xffffffff) {
        pwVar9 = (word *)0x0;
      }
      else {
        if (((int)uVar4 < 0) || (p->vObjs->nSize <= (int)uVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                        ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        pwVar9 = p->vObjs->pArray + uVar4;
      }
      if (pwVar9 == (word *)0x0) {
        if (uVar4 == 0xffffffff) {
          return (int *)puVar8;
        }
        __assert_fail("*pPlace == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecHsh.h"
                      ,0x138,"int *Hsh_IntManLookup(Hsh_IntMan_t *, unsigned int *)");
      }
      uVar4 = (int)*pwVar9 * iVar2;
      if (((int)uVar4 < 0) || (p->vData->nSize <= (int)uVar4)) break;
      iVar5 = bcmp(pData,p->vData->pArray + uVar4,(long)iVar2 * 4);
      puVar3 = (uint *)((long)pwVar9 + 4);
      if (iVar5 == 0) {
        return (int *)puVar8;
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

static inline int * Hsh_IntManLookup( Hsh_IntMan_t * p, unsigned * pData )
{
    Hsh_IntObj_t * pObj;
    int * pPlace = Vec_IntEntryP( p->vTable, Hsh_IntManHash(pData, p->nSize, Vec_IntSize(p->vTable)) );
    for ( ; (pObj = Hsh_IntObj(p, *pPlace)); pPlace = &pObj->iNext )
        if ( !memcmp( pData, Hsh_IntData(p, pObj->iData), sizeof(int) * (size_t)p->nSize ) )
            return pPlace;
    assert( *pPlace == -1 );
    return pPlace;
}